

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix3x3.cpp
# Opt level: O1

Matrix3x3 * CGL::operator*(double c,Matrix3x3 *A)

{
  int i_1;
  long lVar1;
  double *pdVar2;
  int i;
  Matrix3x3 *cA;
  double *in_RDI;
  long lVar3;
  long lVar4;
  undefined8 uVar5;
  
  in_RDI[6] = 0.0;
  in_RDI[7] = 0.0;
  in_RDI[4] = 0.0;
  in_RDI[5] = 0.0;
  in_RDI[2] = 0.0;
  in_RDI[3] = 0.0;
  *in_RDI = 0.0;
  in_RDI[1] = 0.0;
  in_RDI[8] = 0.0;
  lVar1 = 0;
  lVar3 = 0;
  pdVar2 = in_RDI;
  do {
    lVar4 = 0;
    do {
      uVar5 = 0x3ff0000000000000;
      if (lVar1 != lVar4) {
        uVar5 = 0;
      }
      *(undefined8 *)((long)pdVar2 + lVar4) = uVar5;
      lVar4 = lVar4 + 0x18;
    } while (lVar4 != 0x48);
    lVar3 = lVar3 + 1;
    pdVar2 = pdVar2 + 1;
    lVar1 = lVar1 + 0x18;
  } while (lVar3 != 3);
  lVar1 = 0;
  do {
    in_RDI[lVar1] = (&A->entries[0].x)[lVar1] * c;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 9);
  return (Matrix3x3 *)in_RDI;
}

Assistant:

Matrix3x3 operator*( double c, const Matrix3x3& A ) {

    Matrix3x3 cA;
    const double* Aij = (const double*) &A;
    double* cAij = (double*) &cA;

    for (int i = 0; i < 9; ++i)
      cAij[i] = c * Aij[i];

    return cA;
  }